

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

char * TEST_add_bool_option(void)

{
  int iVar1;
  char *pcVar2;
  cargo_t cargo;
  int a;
  char *args [3];
  cargo_t local_38;
  int local_2c;
  undefined8 local_28;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  char *local_18;
  
  iVar1 = cargo_init(&local_38,0,"program");
  if (iVar1 == 0) {
    local_18 = "1";
    local_28._0_4_ = 0x12aaaa;
    local_28._4_4_ = 0;
    uStack_20 = 0x127dbd;
    uStack_1c = 0;
    iVar1 = cargo_add_option(local_38,0,"--alpha -a","Description","b",&local_2c);
    if (iVar1 == 0) {
      iVar1 = cargo_parse(local_38,0,1,3,(char **)&local_28);
      if (iVar1 == 0) {
        puts("Attempt to parse value: 1");
        pcVar2 = (char *)0x0;
        if (local_2c != 1) {
          pcVar2 = "Failed to parse correct value 1";
        }
      }
      else {
        pcVar2 = "Failed to parse int with value \"1\"";
      }
    }
    else {
      pcVar2 = "Failed to add valid int option";
    }
    cargo_destroy(&local_38);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_add_static_string_option)
{
    char b[10];
    char *args[] = { "program", "--beta", "abc" };
    ret = cargo_add_option(cargo, 0, "--beta -b",
                            "Description",
                            ".s#",
                            &b, sizeof(b));
    cargo_assert(ret == 0, "Failed to add valid static string option");

    if (cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args))
    {
        msg = "Failed to parse static char * with value \"abc\"";
        goto fail;
    }
    printf("Attempt to parse value: abc\n");
    cargo_assert(!strcmp(b, "abc"), "Failed to parse correct value abc");
    _TEST_CLEANUP();
}